

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O3

char * gguf_get_val_str(gguf_context *ctx,int64_t key_id)

{
  pointer pgVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  long lVar4;
  char *pcVar5;
  int line;
  
  if ((key_id < 0) ||
     (pgVar1 = (ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
               super__Vector_impl_data._M_start,
     lVar4 = ((long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pgVar1 >> 3) * 0x2e8ba2e8ba2e8ba3,
     lVar4 - key_id == 0 || lVar4 < key_id)) {
    pcVar5 = "key_id >= 0 && key_id < gguf_get_n_kv(ctx)";
    line = 0x365;
  }
  else {
    sVar2 = gguf_kv::get_ne(pgVar1 + key_id);
    if (sVar2 == 1) {
      pbVar3 = gguf_kv::get_val<std::__cxx11::string>
                         ((ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                          super__Vector_impl_data._M_start + key_id,0);
      return (pbVar3->_M_dataplus)._M_p;
    }
    pcVar5 = "ctx->kv[key_id].get_ne() == 1";
    line = 0x366;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
             ,line,"GGML_ASSERT(%s) failed",pcVar5);
}

Assistant:

const char * gguf_get_val_str(const struct gguf_context * ctx, int64_t key_id) {
    GGML_ASSERT(key_id >= 0 && key_id < gguf_get_n_kv(ctx));
    GGML_ASSERT(ctx->kv[key_id].get_ne() == 1);
    return ctx->kv[key_id].get_val<std::string>().c_str();
}